

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSampleVerifier.cpp
# Opt level: O3

void __thiscall
vkt::texture::SampleVerifier::getFilteredSample1D
          (SampleVerifier *this,IVec3 *texelBase,float weight,int layer,int level,Vec4 *resultMin,
          Vec4 *resultMax)

{
  bool bVar1;
  Vec4 *pVVar2;
  double *pdVar3;
  long lVar4;
  Vec4 *pVVar5;
  bool bVar6;
  Interval *x;
  int compNdx;
  undefined4 uVar7;
  float fVar8;
  Interval weightInterval;
  Vec4 texelsMax [2];
  Vec4 texelsMin [2];
  Interval resultIntervals [4];
  undefined1 local_168 [16];
  double dStack_158;
  Vec4 *local_150;
  Vec4 *local_148;
  Interval local_140;
  Vec4 local_128;
  Vec4 local_118;
  Vec4 local_108;
  Vec4 local_f8;
  Interval local_e0;
  Interval local_c8 [4];
  Interval local_60;
  Interval local_48;
  
  local_f8.m_data[0] = 0.0;
  local_f8.m_data[1] = 0.0;
  local_f8.m_data[2] = 0.0;
  local_f8.m_data[3] = 0.0;
  local_108.m_data[0] = 0.0;
  local_108.m_data[1] = 0.0;
  local_108.m_data[2] = 0.0;
  local_108.m_data[3] = 0.0;
  local_118.m_data[0] = 0.0;
  local_118.m_data[1] = 0.0;
  local_118.m_data[2] = 0.0;
  local_118.m_data[3] = 0.0;
  local_128.m_data[0] = 0.0;
  local_128.m_data[1] = 0.0;
  local_128.m_data[2] = 0.0;
  local_128.m_data[3] = 0.0;
  pVVar5 = &local_108;
  pVVar2 = &local_128;
  uVar7._0_1_ = false;
  uVar7._1_3_ = 0;
  bVar1 = true;
  local_150 = resultMin;
  local_148 = resultMax;
  do {
    bVar6 = bVar1;
    local_140.m_hasNaN = SUB41(uVar7,0);
    local_140._1_3_ = SUB43(uVar7,1);
    local_140._4_8_ = 0;
    local_c8[0].m_hasNaN = false;
    local_c8[0]._1_7_ = 0;
    local_c8[0].m_lo._0_4_ = 0;
    lVar4 = 0;
    do {
      *(int *)(&local_c8[0].m_hasNaN + lVar4 * 4) =
           *(int *)(&local_140.m_hasNaN + lVar4 * 4) + texelBase->m_data[lVar4];
      lVar4 = lVar4 + 1;
    } while (lVar4 != 3);
    uVar7._0_1_ = true;
    uVar7._1_3_ = 0;
    fetchTexel(this,(IVec3 *)local_c8,layer,level,VK_FILTER_LINEAR,pVVar5,pVVar2);
    pVVar2 = &local_118;
    pVVar5 = &local_f8;
    bVar1 = false;
  } while (bVar6);
  lVar4 = 8;
  do {
    *(undefined1 *)((long)local_c8 + lVar4 + -8) = 0;
    *(undefined8 *)(&local_c8[0].m_hasNaN + lVar4) = 0x7ff0000000000000;
    *(undefined8 *)((long)&local_c8[0].m_lo + lVar4) = 0xfff0000000000000;
    lVar4 = lVar4 + 0x18;
  } while (lVar4 != 0x68);
  lVar4 = 8;
  do {
    *(undefined1 *)((long)local_c8 + lVar4 + -8) = 0;
    *(undefined8 *)(&local_c8[0].m_hasNaN + lVar4) = 0;
    *(undefined8 *)((long)&local_c8[0].m_lo + lVar4) = 0;
    lVar4 = lVar4 + 0x18;
  } while (lVar4 != 0x68);
  pVVar5 = &local_108;
  pVVar2 = &local_128;
  bVar1 = true;
  do {
    bVar6 = bVar1;
    fVar8 = 1.0 - weight;
    if (!bVar6) {
      fVar8 = weight;
    }
    local_168[0] = NAN(fVar8);
    local_168._8_8_ = INFINITY;
    if (!local_168[0]) {
      local_168._8_8_ = (double)fVar8;
    }
    dStack_158 = -INFINITY;
    if (!local_168[0]) {
      dStack_158 = (double)fVar8;
    }
    tcu::FloatFormat::roundOut(&local_140,&this->m_filteringPrecision,(Interval *)local_168,false);
    x = local_c8;
    lVar4 = 0;
    do {
      local_168[0] = false;
      unique0x10000114 = SUB84((double)pVVar2->m_data[lVar4],0);
      local_168._8_8_ = (double)pVVar5->m_data[lVar4];
      unique0x10000118 = (int)((ulong)(double)pVVar2->m_data[lVar4] >> 0x20);
      tcu::operator*(&local_60,&local_140,(Interval *)local_168);
      tcu::operator+(&local_48,x,&local_60);
      tcu::FloatFormat::roundOut(&local_e0,&this->m_filteringPrecision,&local_48,false);
      x->m_hi = local_e0.m_hi;
      x->m_hasNaN = local_e0.m_hasNaN;
      *(undefined7 *)&x->field_0x1 = local_e0._1_7_;
      x->m_lo = local_e0.m_lo;
      lVar4 = lVar4 + 1;
      x = x + 1;
    } while (lVar4 != 4);
    pVVar2 = &local_118;
    pVVar5 = &local_f8;
    bVar1 = false;
  } while (bVar6);
  pdVar3 = &local_c8[0].m_hi;
  lVar4 = 0;
  do {
    local_150->m_data[lVar4] = (float)pdVar3[-1];
    local_148->m_data[lVar4] = (float)*pdVar3;
    lVar4 = lVar4 + 1;
    pdVar3 = pdVar3 + 3;
  } while (lVar4 != 4);
  return;
}

Assistant:

void SampleVerifier::getFilteredSample1D (const IVec3&	texelBase,
										  float			weight,
										  int			layer,
										  int			level,
										  Vec4&			resultMin,
										  Vec4&			resultMax) const
{
	Vec4 texelsMin[2];
	Vec4 texelsMax[2];

	for (int i = 0; i < 2; ++i)
	{
	    fetchTexel(texelBase + IVec3(i, 0, 0), layer, level, VK_FILTER_LINEAR, texelsMin[i], texelsMax[i]);
	}

	Interval resultIntervals[4];

	for (int ndx = 0; ndx < 4; ++ndx)
	{
		resultIntervals[ndx] = Interval(0.0);
	}

    for (int i = 0; i < 2; ++i)
	{
		const Interval weightInterval = m_filteringPrecision.roundOut(Interval(i == 0 ? 1.0f - weight : weight), false);

		for (int compNdx = 0; compNdx < 4; ++compNdx)
		{
			const Interval texelInterval(false, texelsMin[i][compNdx], texelsMax[i][compNdx]);

			resultIntervals[compNdx] = m_filteringPrecision.roundOut(resultIntervals[compNdx] + weightInterval * texelInterval, false);
		}
	}

	for (int compNdx = 0; compNdx < 4; ++compNdx)
	{
		resultMin[compNdx] = (float)resultIntervals[compNdx].lo();
		resultMax[compNdx] = (float)resultIntervals[compNdx].hi();
	}
}